

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  bool local_42;
  bool local_41;
  StringPiece local_40;
  StringPiece local_30;
  string *local_20;
  string *package_name_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  local_20 = package_name;
  package_name_local = (string *)file;
  file_local = (FileDescriptor *)this;
  psVar2 = FileDescriptor::package_abi_cxx11_(file);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_30,psVar2);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,local_20);
  bVar1 = HasPrefixString(local_30,local_40);
  local_41 = false;
  if (bVar1) {
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)package_name_local);
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    local_42 = true;
    if (lVar3 != lVar4) {
      psVar2 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)package_name_local);
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
      local_42 = *pcVar5 == '.';
    }
    local_41 = local_42;
  }
  return local_41;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const std::string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}